

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

float ImGui::GetColumnOffset(int column_index)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = GImGui->CurrentWindow;
  if (column_index < 0) {
    column_index = (pIVar2->DC).ColumnsCurrent;
  }
  if (column_index < (pIVar2->DC).ColumnsData.Size) {
    fVar1 = (pIVar2->DC).ColumnsMinX;
    return ((pIVar2->DC).ColumnsMaxX - fVar1) *
           (pIVar2->DC).ColumnsData.Data[column_index].OffsetNorm + fVar1;
  }
  __assert_fail("column_index < window->DC.ColumnsData.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x276e,"float ImGui::GetColumnOffset(int)");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }